

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O2

Gia_Man_t * Gia_ManRemoveEnables2(Gia_Man_t *p)

{
  undefined8 uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iLit0;
  int iLit1;
  uint uVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  int iVar11;
  Gia_Obj_t *pObj1;
  Gia_Obj_t *pObj0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar11 = 0; iVar11 < p->vCis->nSize; iVar11 = iVar11 + 1) {
    pGVar6 = Gia_ManCi(p,iVar11);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar3 = Gia_ManAppendCi(p_00);
    pGVar6->Value = uVar3;
  }
  for (iVar11 = 0; iVar11 < p->nObjs; iVar11 = iVar11 + 1) {
    pGVar6 = Gia_ManObj(p,iVar11);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
      iLit0 = Gia_ObjFanin0Copy(pGVar6);
      iLit1 = Gia_ObjFanin1Copy(pGVar6);
      uVar3 = Gia_ManHashAnd(p_00,iLit0,iLit1);
      pGVar6->Value = uVar3;
    }
  }
  for (iVar11 = 0; iVar11 < p->vCos->nSize - p->nRegs; iVar11 = iVar11 + 1) {
    pGVar6 = Gia_ManCo(p,iVar11);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar3 = Gia_ObjFanin0Copy(pGVar6);
    pGVar6->Value = uVar3;
  }
  for (uVar3 = 0; (int)uVar3 < p->nRegs; uVar3 = uVar3 + 1) {
    pGVar6 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + uVar3);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar1 = *(undefined8 *)pGVar6;
    iVar11 = Gia_ObjIsMuxType(pGVar6 + -(ulong)((uint)uVar1 & 0x1fffffff));
    if (iVar11 == 0) {
      pcVar5 = "Cannot recognize enable of flop %d.\n";
LAB_005c675b:
      printf(pcVar5,(ulong)uVar3);
    }
    else {
      pGVar7 = Gia_ObjRecognizeMux(pGVar6 + -(ulong)((uint)uVar1 & 0x1fffffff),&local_40,&local_38);
      pGVar8 = Gia_ObjRiToRo(p,pGVar6);
      if ((pGVar8 != (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe)) &&
         (pGVar8 != (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe))) {
        pcVar5 = "Cannot recognize self-loop of enable flop %d.\n";
        goto LAB_005c675b;
      }
      if ((pGVar6->field_0x3 & 0x20) == 0) {
        local_38 = (Gia_Obj_t *)((ulong)local_38 ^ 1);
        local_40 = (Gia_Obj_t *)((ulong)local_40 ^ 1);
      }
      pGVar2 = local_38;
      if (((ulong)pGVar7 & 1) != 0) {
        local_38 = local_40;
        local_40 = pGVar2;
      }
      if (pGVar8 == (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe)) {
        uVar4 = ((Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe))->Value;
        uVar10 = (uint)local_40;
LAB_005c6770:
        uVar4 = Abc_LitNotCond(uVar4,~uVar10 & 1);
        pGVar6->Value = uVar4;
      }
      else if (pGVar8 == (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe)) {
        uVar4 = ((Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe))->Value;
        uVar10 = (uint)local_38;
        goto LAB_005c6770;
      }
    }
  }
  for (iVar11 = 0; iVar11 < p->vCos->nSize; iVar11 = iVar11 + 1) {
    pGVar6 = Gia_ManCo(p,iVar11);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    Gia_ManAppendCo(p_00,pGVar6->Value);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManRemoveEnables2( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pAux; 
    Gia_Obj_t * pTemp, * pObjC, * pObj0, * pObj1, * pFlopIn, * pFlopOut;
    Gia_Obj_t * pThis, * pNode;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pThis, i )
        pThis->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pThis, i )
        pThis->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pThis), Gia_ObjFanin1Copy(pThis) );
    Gia_ManForEachPo( p, pThis, i )
        pThis->Value = Gia_ObjFanin0Copy(pThis);
    Gia_ManForEachRi( p, pFlopIn, i )
    {
        pNode = Gia_ObjFanin0(pFlopIn);
        if ( !Gia_ObjIsMuxType(pNode) )
        {
            printf( "Cannot recognize enable of flop %d.\n", i );
            continue;
        }
        pObjC = Gia_ObjRecognizeMux( pNode, &pObj1, &pObj0 );
        pFlopOut = Gia_ObjRiToRo( p, pFlopIn );
        if ( Gia_Regular(pObj0) != pFlopOut && Gia_Regular(pObj1) != pFlopOut )
        {
            printf( "Cannot recognize self-loop of enable flop %d.\n", i );
            continue;
        }
        if ( !Gia_ObjFaninC0(pFlopIn) )
        {
            pObj0 = Gia_Not(pObj0);
            pObj1 = Gia_Not(pObj1);
        }
        if ( Gia_IsComplement(pObjC) )
        {
            pObjC = Gia_Not(pObjC);
            pTemp = pObj0;
            pObj0 = pObj1;
            pObj1 = pTemp;
        }
        if ( Gia_Regular(pObj0) == pFlopOut )
        {
//            printf( "FlopIn compl = %d. FlopOut is d0. Complement = %d.\n", 
//                Gia_ObjFaninC0(pFlopIn), Gia_IsComplement(pObj0) );
            pFlopIn->Value = Abc_LitNotCond(Gia_Regular(pObj1)->Value, !Gia_IsComplement(pObj1));
        }
        else if ( Gia_Regular(pObj1) == pFlopOut )
        {
//            printf( "FlopIn compl = %d. FlopOut is d1. Complement = %d.\n", 
//                Gia_ObjFaninC0(pFlopIn), Gia_IsComplement(pObj1) );
            pFlopIn->Value = Abc_LitNotCond(Gia_Regular(pObj0)->Value, !Gia_IsComplement(pObj0));
        }
    }
    Gia_ManForEachCo( p, pThis, i )
        Gia_ManAppendCo( pNew, pThis->Value );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pAux = pNew );
    Gia_ManStop( pAux );
    return pNew;
}